

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O3

string * __thiscall
cmGlobalUnixMakefileGenerator3::GetEditCacheCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalUnixMakefileGenerator3 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  cmake *this_00;
  size_type sVar4;
  string *psVar5;
  char *pcVar6;
  size_t sVar7;
  char *__s;
  string editCacheCommand;
  string local_68;
  string local_48;
  
  cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_(&local_48,(cmGlobalGenerator *)this);
  sVar4 = local_48._M_string_length;
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (sVar4 != 0) {
    psVar5 = cmSystemTools::GetCMakeGUICommand_abi_cxx11_();
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (psVar5->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + psVar5->_M_string_length);
    return __return_storage_ptr__;
  }
  this_00 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
  pcVar3 = (this_00->CMakeEditCommand)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar3,pcVar3 + (this_00->CMakeEditCommand)._M_string_length);
  paVar2 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"CMAKE_EDIT_COMMAND","");
  pcVar6 = cmake::GetCacheDefinition(this_00,&local_68);
  sVar4 = local_48._M_string_length;
  if (pcVar6 == (char *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (sVar4 == 0) goto LAB_00360d86;
  }
  if (local_48._M_string_length == 0) {
    cmSystemTools::GetCMakeCursesCommand_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)&local_48);
    if (local_48._M_string_length == 0) {
      cmSystemTools::GetCMakeGUICommand_abi_cxx11_();
      std::__cxx11::string::_M_assign((string *)&local_48);
      if (local_48._M_string_length == 0) goto LAB_00360d86;
    }
  }
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"CMAKE_EDIT_COMMAND","");
  cmake::AddCacheEntry
            (this_00,&local_68,local_48._M_dataplus._M_p,"Path to cache edit program executable.",4)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
LAB_00360d86:
  local_68._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"CMAKE_EDIT_COMMAND","");
  pcVar6 = cmake::GetCacheDefinition(this_00,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  __s = "";
  if (pcVar6 != (char *)0x0) {
    __s = pcVar6;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar7 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,__s + sVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalUnixMakefileGenerator3::GetEditCacheCommand() const
{
  // If generating for an extra IDE, the edit_cache target cannot
  // launch a terminal-interactive tool, so always use cmake-gui.
  if(!this->GetExtraGeneratorName().empty())
    {
    return cmSystemTools::GetCMakeGUICommand();
    }

  // Use an internal cache entry to track the latest dialog used
  // to edit the cache, and use that for the edit_cache target.
  cmake* cm = this->GetCMakeInstance();
  std::string editCacheCommand = cm->GetCMakeEditCommand();
  if(!cm->GetCacheDefinition("CMAKE_EDIT_COMMAND") ||
     !editCacheCommand.empty())
    {
    if(editCacheCommand.empty())
      {
      editCacheCommand = cmSystemTools::GetCMakeCursesCommand();
      }
    if(editCacheCommand.empty())
      {
      editCacheCommand = cmSystemTools::GetCMakeGUICommand();
      }
    if(!editCacheCommand.empty())
      {
      cm->AddCacheEntry
        ("CMAKE_EDIT_COMMAND", editCacheCommand.c_str(),
         "Path to cache edit program executable.", cmState::INTERNAL);
      }
    }
  const char* edit_cmd = cm->GetCacheDefinition("CMAKE_EDIT_COMMAND");
  return edit_cmd? edit_cmd : "";
}